

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.cpp
# Opt level: O0

void __thiscall QTextFormat::setObjectIndex(QTextFormat *this,int o)

{
  long lVar1;
  QTextFormatPrivate *pQVar2;
  int in_ESI;
  QTextFormatPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextFormatPrivate *in_stack_ffffffffffffffa8;
  QTextFormatPrivate *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  qint32 key;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  
  key = (qint32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == -1) {
    pQVar2 = QSharedDataPointer<QTextFormatPrivate>::constData
                       ((QSharedDataPointer<QTextFormatPrivate> *)0x84577a);
    if (pQVar2 != (QTextFormatPrivate *)0x0) {
      QSharedDataPointer<QTextFormatPrivate>::operator->
                ((QSharedDataPointer<QTextFormatPrivate> *)in_stack_ffffffffffffffb0);
      QTextFormatPrivate::clearProperty(in_RDI,key);
    }
  }
  else {
    pQVar2 = QSharedDataPointer<QTextFormatPrivate>::constData
                       ((QSharedDataPointer<QTextFormatPrivate> *)0x8457a0);
    if (pQVar2 == (QTextFormatPrivate *)0x0) {
      operator_new(0x40);
      QTextFormatPrivate::QTextFormatPrivate(in_stack_ffffffffffffffb0);
      QSharedDataPointer<QTextFormatPrivate>::operator=
                ((QSharedDataPointer<QTextFormatPrivate> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
    QSharedDataPointer<QTextFormatPrivate>::operator->
              ((QSharedDataPointer<QTextFormatPrivate> *)in_stack_ffffffffffffffb0);
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,in_ESI);
    QTextFormatPrivate::insertProperty
              ((QTextFormatPrivate *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               (QVariant *)in_RDI);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextFormat::setObjectIndex(int o)
{
    if (o == -1) {
        if (d.constData())
            d->clearProperty(ObjectIndex);
    } else {
        if (!d.constData())
            d = new QTextFormatPrivate;
        // ### type
        d->insertProperty(ObjectIndex, o);
    }
}